

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseOneof
          (Parser *this,OneofDescriptorProto *oneof_decl,DescriptorProto *containing_type,
          int oneof_index,LocationRecorder *oneof_location,
          LocationRecorder *containing_type_location,FileDescriptorProto *containing_file)

{
  Tokenizer *pTVar1;
  pointer __s1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  string *output;
  FieldDescriptorProto *field;
  OneofOptions *pOVar5;
  Arena *pAVar6;
  size_type __rlen;
  string_view text;
  string_view text_00;
  string_view text_01;
  LocationRecorder name_location;
  LocationRecorder local_58;
  RepeatedPtrField<google::protobuf::DescriptorProto> *local_40;
  RepeatedPtrFieldBase *local_38;
  
  text._M_str = "oneof";
  text._M_len = 5;
  bVar3 = Consume(this,text);
  if (bVar3) {
    LocationRecorder::Init(&local_58,oneof_location,oneof_location->source_code_info_);
    RepeatedField<int>::Add(&((local_58.location_)->field_0)._impl_.path_,1);
    *(byte *)&oneof_decl->field_0 = *(byte *)&oneof_decl->field_0 | 1;
    pAVar6 = (Arena *)(oneof_decl->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar6 & 1) != 0) {
      pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
    }
    output = internal::ArenaStringPtr::Mutable_abi_cxx11_
                       (&(oneof_decl->field_0)._impl_.name_,pAVar6);
    bVar3 = ConsumeIdentifier(this,output,(ErrorMaker)ZEXT816(0x3e94e5));
    LocationRecorder::~LocationRecorder(&local_58);
    if ((bVar3) &&
       (text_00._M_str = "{", text_00._M_len = 1,
       bVar3 = ConsumeEndOfDeclaration(this,text_00,oneof_location), bVar3)) {
      local_38 = &(containing_type->field_0)._impl_.field_.super_RepeatedPtrFieldBase;
      local_40 = (RepeatedPtrField<google::protobuf::DescriptorProto> *)
                 ((long)&containing_type->field_0 + 0x20);
      do {
        pTVar1 = this->input_;
        if ((pTVar1->current_).type == TYPE_END) {
          RecordError(this,(ErrorMaker)ZEXT816(0x3e94fa));
          return false;
        }
        __s1 = (pTVar1->current_).text._M_dataplus._M_p;
        sVar2 = (pTVar1->current_).text._M_string_length;
        if (sVar2 == 8) {
          iVar4 = bcmp(__s1,"required",8);
          if (((iVar4 == 0) || (iVar4 = bcmp(__s1,"optional",8), iVar4 == 0)) ||
             (iVar4 = bcmp(__s1,"repeated",8), iVar4 == 0)) {
            RecordError(this,(ErrorMaker)ZEXT816(0x3e953b));
            io::Tokenizer::Next(this->input_);
          }
LAB_001fd4ef:
          LocationRecorder::LocationRecorder
                    (&local_58,containing_type_location,2,
                     *(int *)((long)&containing_type->field_0 + 0x10));
          field = (FieldDescriptorProto *)
                  internal::RepeatedPtrFieldBase::AddMessageLite
                            (local_38,Arena::
                                      DefaultConstruct<google::protobuf::FieldDescriptorProto>);
          bVar3 = internal::ValidateEnum(1,(uint32_t *)&FieldDescriptorProto_Label_internal_data_);
          if (!bVar3) {
            __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FieldDescriptorProto_Label_internal_data_)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                          ,0x3a33,
                          "void google::protobuf::FieldDescriptorProto::_internal_set_label(::google::protobuf::FieldDescriptorProto_Label)"
                         );
          }
          (field->field_0)._impl_.label_ = 1;
          (field->field_0)._impl_.oneof_index_ = oneof_index;
          (field->field_0)._impl_._has_bits_.has_bits_[0] =
               (field->field_0)._impl_._has_bits_.has_bits_[0] | 0x280;
          bVar3 = ParseMessageFieldNoLabel
                            (this,field,local_40,containing_type_location,3,&local_58,
                             containing_file);
          if (!bVar3) {
            SkipStatement(this);
          }
          LocationRecorder::~LocationRecorder(&local_58);
        }
        else {
          if ((sVar2 != 6) || (iVar4 = bcmp(__s1,"option",6), iVar4 != 0)) goto LAB_001fd4ef;
          LocationRecorder::Init(&local_58,oneof_location,oneof_location->source_code_info_);
          RepeatedField<int>::Add(&((local_58.location_)->field_0)._impl_.path_,2);
          *(byte *)&oneof_decl->field_0 = *(byte *)&oneof_decl->field_0 | 2;
          if ((oneof_decl->field_0)._impl_.options_ == (OneofOptions *)0x0) {
            pAVar6 = (Arena *)(oneof_decl->super_Message).super_MessageLite._internal_metadata_.ptr_
            ;
            if (((ulong)pAVar6 & 1) != 0) {
              pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
            }
            pOVar5 = (OneofOptions *)Arena::DefaultConstruct<google::protobuf::OneofOptions>(pAVar6)
            ;
            (oneof_decl->field_0)._impl_.options_ = pOVar5;
          }
          bVar3 = ParseOption(this,&((oneof_decl->field_0)._impl_.options_)->super_Message,&local_58
                              ,containing_file,OPTION_STATEMENT);
          LocationRecorder::~LocationRecorder(&local_58);
          if (!bVar3) {
            return false;
          }
        }
        text_01._M_str = "}";
        text_01._M_len = 1;
        bVar3 = TryConsumeEndOfDeclaration(this,text_01,(LocationRecorder *)0x0);
        if (bVar3) {
          return true;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool Parser::ParseOneof(OneofDescriptorProto* oneof_decl,
                        DescriptorProto* containing_type, int oneof_index,
                        const LocationRecorder& oneof_location,
                        const LocationRecorder& containing_type_location,
                        const FileDescriptorProto* containing_file) {
  DO(Consume("oneof"));

  {
    LocationRecorder name_location(oneof_location,
                                   OneofDescriptorProto::kNameFieldNumber);
    DO(ConsumeIdentifier(oneof_decl->mutable_name(), "Expected oneof name."));
  }

  DO(ConsumeEndOfDeclaration("{", &oneof_location));

  do {
    if (AtEnd()) {
      RecordError("Reached end of input in oneof definition (missing '}').");
      return false;
    }

    if (LookingAt("option")) {
      LocationRecorder option_location(
          oneof_location, OneofDescriptorProto::kOptionsFieldNumber);
      if (!ParseOption(oneof_decl->mutable_options(), option_location,
                       containing_file, OPTION_STATEMENT)) {
        return false;
      }
      continue;
    }

    // Print a nice error if the user accidentally tries to place a label
    // on an individual member of a oneof.
    if (LookingAt("required") || LookingAt("optional") ||
        LookingAt("repeated")) {
      RecordError(
          "Fields in oneofs must not have labels (required / optional "
          "/ repeated).");
      // We can continue parsing here because we understand what the user
      // meant.  The error report will still make parsing fail overall.
      input_->Next();
    }

    LocationRecorder field_location(containing_type_location,
                                    DescriptorProto::kFieldFieldNumber,
                                    containing_type->field_size());

    FieldDescriptorProto* field = containing_type->add_field();
    field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
    field->set_oneof_index(oneof_index);

    if (!ParseMessageFieldNoLabel(field, containing_type->mutable_nested_type(),
                                  containing_type_location,
                                  DescriptorProto::kNestedTypeFieldNumber,
                                  field_location, containing_file)) {
      // This statement failed to parse.  Skip it, but keep looping to parse
      // other statements.
      SkipStatement();
    }
  } while (!TryConsumeEndOfDeclaration("}", nullptr));

  return true;
}